

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_1::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool is_upper)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  undefined1 local_5c;
  undefined8 local_28;
  size_t i;
  bool is_upper_local;
  string *input_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = 0; uVar3 = std::__cxx11::string::length(), local_28 < uVar3;
      local_28 = local_28 + 1) {
    if ((local_28 == 0) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar4 == '_')) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar4);
      uVar3 = std::__cxx11::string::length();
      if (1 < uVar3) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
        bVar1 = is_alpha(*pcVar4);
        if (bVar1) {
          local_28 = 1;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
          cVar2 = CharToUpper(*pcVar4);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
        }
      }
    }
    else if (local_28 == 0) {
      if (is_upper) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
        local_5c = CharToUpper(*pcVar4);
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
        local_5c = CharToLower(*pcVar4);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_5c);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
      if ((*pcVar4 == '_') && (uVar3 = std::__cxx11::string::length(), local_28 + 1 < uVar3)) {
        local_28 = local_28 + 1;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
        cVar2 = CharToUpper(*pcVar4);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar4);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ToCamelCase(const std::string &input, bool is_upper) {
  std::string s;
  for (size_t i = 0; i < input.length(); i++) {
    if (!i && input[i] == '_') {
      s += input[i];
      // we ignore leading underscore but make following
      // alphabet char upper.
      if (i + 1 < input.length() && is_alpha(input[i + 1]))
        s += CharToUpper(input[++i]);
    } else if (!i)
      s += is_upper ? CharToUpper(input[i]) : CharToLower(input[i]);
    else if (input[i] == '_' && i + 1 < input.length())
      s += CharToUpper(input[++i]);
    else
      s += input[i];
  }
  return s;
}